

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlParseSGMLCatalog(xmlCatalogPtr catal,xmlChar *value,char *file,int super)

{
  byte bVar1;
  xmlCatalogPtr pxVar2;
  int iVar3;
  xmlChar *base;
  byte *pbVar4;
  xmlChar *pxVar5;
  xmlCatalogEntryPtr pxVar6;
  xmlChar *pxVar7;
  ulong uVar8;
  xmlChar *pxVar9;
  xmlCatalogEntryType type;
  bool bVar10;
  xmlChar *name;
  xmlChar *sysid;
  xmlChar *local_58;
  int local_4c;
  xmlChar *local_48;
  xmlCatalogPtr local_40;
  int local_34;
  
  if (file == (char *)0x0) {
    return -1;
  }
  base = xmlStrdup((xmlChar *)file);
  pxVar2 = catal;
  if (value != (xmlChar *)0x0) {
LAB_001634f4:
    local_40 = pxVar2;
    if (*value != 0) {
      pbVar4 = value + 4;
      while( true ) {
        uVar8 = (ulong)*value;
        if (0x2d < uVar8) break;
        if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
          if (uVar8 == 0) {
            iVar3 = 0;
            goto LAB_00163a52;
          }
          if ((uVar8 == 0x2d) && (value[1] == 0x2d)) {
            if (*value == 0x2d) goto LAB_0016353b;
            goto LAB_0016374c;
          }
          break;
        }
        value = value + 1;
        pbVar4 = pbVar4 + 1;
      }
      local_48 = (xmlChar *)0x0;
      local_58 = (xmlChar *)0x0;
      value = xmlParseSGMLCatalogName(value,&local_58);
      pxVar5 = local_58;
      bVar10 = true;
      if (local_58 != (xmlChar *)0x0 && value != (byte *)0x0) {
        if ((0x20 < (ulong)*value) || ((0x100002600U >> ((ulong)*value & 0x3f) & 1) == 0)) {
          (*xmlFree)(local_58);
          goto LAB_001639b8;
        }
        while (((ulong)*value < 0x21 && ((0x100002600U >> ((ulong)*value & 0x3f) & 1) != 0))) {
          value = value + 1;
        }
        local_4c = super;
        local_34 = xmlStrEqual(local_58,"SYSTEM");
        type = SGML_CATA_SYSTEM;
        if (local_34 == 0) {
          iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"PUBLIC");
          type = SGML_CATA_PUBLIC;
          if (iVar3 == 0) {
            iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"DELEGATE");
            type = SGML_CATA_DELEGATE;
            if (iVar3 == 0) {
              iVar3 = xmlStrEqual(pxVar5,"ENTITY");
              type = SGML_CATA_ENTITY;
              if (iVar3 == 0) {
                iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"DOCTYPE");
                type = SGML_CATA_DOCTYPE;
                if (iVar3 == 0) {
                  iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"LINKTYPE");
                  type = SGML_CATA_LINKTYPE;
                  if (iVar3 == 0) {
                    iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"NOTATION");
                    type = SGML_CATA_NOTATION;
                    if (iVar3 == 0) {
                      iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"SGMLDECL");
                      type = SGML_CATA_SGMLDECL;
                      if (iVar3 == 0) {
                        iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"DOCUMENT");
                        type = SGML_CATA_DOCUMENT;
                        if (iVar3 == 0) {
                          iVar3 = xmlStrEqual(pxVar5,"CATALOG");
                          type = SGML_CATA_CATALOG;
                          if (iVar3 == 0) {
                            iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"BASE");
                            type = SGML_CATA_BASE;
                            if (iVar3 == 0) {
                              iVar3 = xmlStrEqual(pxVar5,(xmlChar *)"OVERRIDE");
                              if (iVar3 != 0) {
                                (*xmlFree)(pxVar5);
                                value = xmlParseSGMLCatalogName(value,&local_58);
                                bVar10 = local_58 != (xmlChar *)0x0;
                                if (bVar10) {
                                  (*xmlFree)(local_58);
                                }
                                bVar10 = !bVar10;
                                super = local_4c;
                                goto LAB_001639b8;
                              }
                              type = XML_CATA_NONE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        (*xmlFree)(pxVar5);
        local_58 = (xmlChar *)0x0;
        switch(type) {
        case SGML_CATA_SYSTEM:
        case SGML_CATA_PUBLIC:
        case SGML_CATA_DELEGATE:
          value = xmlParseSGMLCatalogPubid(value,&local_58);
          pxVar5 = local_58;
          if (value != (byte *)0x0) {
            pxVar9 = local_58;
            if ((local_34 == 0) &&
               (pxVar7 = xmlCatalogNormalizePublic(local_58), pxVar9 = local_58,
               pxVar7 != (xmlChar *)0x0)) {
              if (pxVar5 != (xmlChar *)0x0) {
                (*xmlFree)(pxVar5);
              }
              pxVar9 = pxVar7;
              if (*pxVar7 == '\0') {
                (*xmlFree)(pxVar7);
                local_58 = (xmlChar *)0x0;
                pxVar9 = local_58;
              }
            }
            local_58 = pxVar9;
            if (((ulong)*value < 0x21) && ((0x100002600U >> ((ulong)*value & 0x3f) & 1) != 0)) {
              while (((ulong)*value < 0x21 && ((0x100002600U >> ((ulong)*value & 0x3f) & 1) != 0)))
              {
                value = value + 1;
              }
              goto switchD_00163727_caseD_15;
            }
            break;
          }
          goto LAB_00163808;
        case SGML_CATA_ENTITY:
          type = (uint)(*value == 0x25) + SGML_CATA_ENTITY;
        case SGML_CATA_PENTITY:
        case SGML_CATA_DOCTYPE:
        case SGML_CATA_LINKTYPE:
        case SGML_CATA_NOTATION:
          value = xmlParseSGMLCatalogName(value,&local_58);
          if (value == (byte *)0x0) {
LAB_00163808:
            value = (byte *)0x0;
          }
          else if (((ulong)*value < 0x21) && ((0x100002600U >> ((ulong)*value & 0x3f) & 1) != 0)) {
            while (((ulong)*value < 0x21 && ((0x100002600U >> ((ulong)*value & 0x3f) & 1) != 0))) {
              value = value + 1;
            }
switchD_00163727_caseD_15:
            value = xmlParseSGMLCatalogPubid(value,&local_48);
          }
          break;
        case SGML_CATA_BASE:
        case SGML_CATA_CATALOG:
        case SGML_CATA_DOCUMENT:
        case SGML_CATA_SGMLDECL:
          goto switchD_00163727_caseD_15;
        }
        pxVar5 = local_48;
        if (value == (byte *)0x0) {
          if (local_58 != (xmlChar *)0x0) {
            (*xmlFree)(local_58);
          }
          super = local_4c;
          if (local_48 != (xmlChar *)0x0) {
            (*xmlFree)(local_48);
          }
          value = (byte *)0x0;
        }
        else {
          if (type == SGML_CATA_BASE) {
            if (base != (xmlChar *)0x0) {
              (*xmlFree)(base);
            }
            base = xmlStrdup(local_48);
          }
          else if ((uint)(type + ~XML_CATA_DELEGATE_URI) < 2) {
            pxVar5 = xmlBuildURI(local_48,base);
            pxVar9 = local_58;
            if (pxVar5 != (xmlChar *)0x0) {
              pxVar6 = xmlNewCatalogEntry(type,local_58,pxVar5,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                          (xmlCatalogEntryPtr)0x0);
              iVar3 = xmlHashAddEntry(local_40->sgml,pxVar9,pxVar6);
              if (iVar3 < 0) {
                xmlFreeCatalogEntry(pxVar6,pxVar9);
              }
LAB_00163980:
              (*xmlFree)(pxVar5);
            }
          }
          else if (type == SGML_CATA_CATALOG) {
            if (local_4c == 0) {
              pxVar5 = xmlBuildURI(local_48,base);
              if (pxVar5 != (xmlChar *)0x0) {
                xmlExpandCatalog(local_40,(char *)pxVar5);
                goto LAB_00163980;
              }
            }
            else {
              pxVar6 = xmlNewCatalogEntry(SGML_CATA_CATALOG,local_48,(xmlChar *)0x0,(xmlChar *)0x0,
                                          XML_CATA_PREFER_NONE,(xmlCatalogEntryPtr)0x0);
              iVar3 = xmlHashAddEntry(local_40->sgml,pxVar5,pxVar6);
              if (iVar3 < 0) {
                xmlFreeCatalogEntry(pxVar6,pxVar5);
              }
            }
          }
          if (local_58 != (xmlChar *)0x0) {
            (*xmlFree)(local_58);
          }
          super = local_4c;
          if (local_48 != (xmlChar *)0x0) {
            (*xmlFree)(local_48);
          }
          bVar10 = false;
        }
      }
LAB_001639b8:
      if (!bVar10) goto LAB_001639c1;
    }
    goto LAB_00163a4a;
  }
  iVar3 = -1;
LAB_00163a52:
  if (base != (xmlChar *)0x0) {
    (*xmlFree)(base);
  }
  return iVar3;
LAB_0016353b:
  bVar1 = pbVar4[-2];
  if (bVar1 == 0x2d) {
    if (pbVar4[-1] == 0x2d) goto LAB_0016373e;
  }
  else if (bVar1 == 0) goto LAB_0016373e;
  pbVar4 = pbVar4 + 1;
  goto LAB_0016353b;
LAB_0016373e:
  value = pbVar4;
  if (bVar1 == 0) {
    value = (byte *)0x0;
  }
LAB_0016374c:
  if (value == (byte *)0x0) goto LAB_00163a47;
LAB_001639c1:
  pxVar2 = local_40;
  if (value == (byte *)0x0) goto LAB_00163a47;
  goto LAB_001634f4;
LAB_00163a47:
  value = (byte *)0x0;
LAB_00163a4a:
  iVar3 = -(uint)(value == (byte *)0x0);
  goto LAB_00163a52;
}

Assistant:

static int
xmlParseSGMLCatalog(xmlCatalogPtr catal, const xmlChar *value,
	            const char *file, int super) {
    const xmlChar *cur = value;
    xmlChar *base = NULL;
    int res;

    if ((cur == NULL) || (file == NULL))
        return(-1);
    base = xmlStrdup((const xmlChar *) file);

    while ((cur != NULL) && (cur[0] != 0)) {
	SKIP_BLANKS;
	if (cur[0] == 0)
	    break;
	if ((cur[0] == '-') && (cur[1] == '-')) {
	    cur = xmlParseSGMLCatalogComment(cur);
	    if (cur == NULL) {
		/* error */
		break;
	    }
	} else {
	    xmlChar *sysid = NULL;
	    xmlChar *name = NULL;
	    xmlCatalogEntryType type = XML_CATA_NONE;

	    cur = xmlParseSGMLCatalogName(cur, &name);
	    if (cur == NULL || name == NULL) {
		/* error */
		break;
	    }
	    if (!IS_BLANK_CH(*cur)) {
		/* error */
		xmlFree(name);
		break;
	    }
	    SKIP_BLANKS;
	    if (xmlStrEqual(name, (const xmlChar *) "SYSTEM"))
                type = SGML_CATA_SYSTEM;
	    else if (xmlStrEqual(name, (const xmlChar *) "PUBLIC"))
                type = SGML_CATA_PUBLIC;
	    else if (xmlStrEqual(name, (const xmlChar *) "DELEGATE"))
                type = SGML_CATA_DELEGATE;
	    else if (xmlStrEqual(name, (const xmlChar *) "ENTITY"))
                type = SGML_CATA_ENTITY;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCTYPE"))
                type = SGML_CATA_DOCTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "LINKTYPE"))
                type = SGML_CATA_LINKTYPE;
	    else if (xmlStrEqual(name, (const xmlChar *) "NOTATION"))
                type = SGML_CATA_NOTATION;
	    else if (xmlStrEqual(name, (const xmlChar *) "SGMLDECL"))
                type = SGML_CATA_SGMLDECL;
	    else if (xmlStrEqual(name, (const xmlChar *) "DOCUMENT"))
                type = SGML_CATA_DOCUMENT;
	    else if (xmlStrEqual(name, (const xmlChar *) "CATALOG"))
                type = SGML_CATA_CATALOG;
	    else if (xmlStrEqual(name, (const xmlChar *) "BASE"))
                type = SGML_CATA_BASE;
	    else if (xmlStrEqual(name, (const xmlChar *) "OVERRIDE")) {
		xmlFree(name);
		cur = xmlParseSGMLCatalogName(cur, &name);
		if (name == NULL) {
		    /* error */
		    break;
		}
		xmlFree(name);
		continue;
	    }
	    xmlFree(name);
	    name = NULL;

	    switch(type) {
		case SGML_CATA_ENTITY:
		    if (*cur == '%')
			type = SGML_CATA_PENTITY;
                    /* Falls through. */
		case SGML_CATA_PENTITY:
		case SGML_CATA_DOCTYPE:
		case SGML_CATA_LINKTYPE:
		case SGML_CATA_NOTATION:
		    cur = xmlParseSGMLCatalogName(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_PUBLIC:
		case SGML_CATA_SYSTEM:
		case SGML_CATA_DELEGATE:
		    cur = xmlParseSGMLCatalogPubid(cur, &name);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    if (type != SGML_CATA_SYSTEM) {
		        xmlChar *normid;

		        normid = xmlCatalogNormalizePublic(name);
		        if (normid != NULL) {
		            if (name != NULL)
		                xmlFree(name);
		            if (*normid != 0)
		                name = normid;
		            else {
		                xmlFree(normid);
		                name = NULL;
		            }
		        }
		    }
		    if (!IS_BLANK_CH(*cur)) {
			/* error */
			break;
		    }
		    SKIP_BLANKS;
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		case SGML_CATA_BASE:
		case SGML_CATA_CATALOG:
		case SGML_CATA_DOCUMENT:
		case SGML_CATA_SGMLDECL:
		    cur = xmlParseSGMLCatalogPubid(cur, &sysid);
		    if (cur == NULL) {
			/* error */
			break;
		    }
		    break;
		default:
		    break;
	    }
	    if (cur == NULL) {
		if (name != NULL)
		    xmlFree(name);
		if (sysid != NULL)
		    xmlFree(sysid);
		break;
	    } else if (type == SGML_CATA_BASE) {
		if (base != NULL)
		    xmlFree(base);
		base = xmlStrdup(sysid);
	    } else if ((type == SGML_CATA_PUBLIC) ||
		       (type == SGML_CATA_SYSTEM)) {
		xmlChar *filename;

		filename = xmlBuildURI(sysid, base);
		if (filename != NULL) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, name, filename,
			                       NULL, XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, name, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		    xmlFree(filename);
		}

	    } else if (type == SGML_CATA_CATALOG) {
		if (super) {
		    xmlCatalogEntryPtr entry;

		    entry = xmlNewCatalogEntry(type, sysid, NULL, NULL,
			                       XML_CATA_PREFER_NONE, NULL);
		    res = xmlHashAddEntry(catal->sgml, sysid, entry);
		    if (res < 0) {
			xmlFreeCatalogEntry(entry, NULL);
		    }
		} else {
		    xmlChar *filename;

		    filename = xmlBuildURI(sysid, base);
		    if (filename != NULL) {
			xmlExpandCatalog(catal, (const char *)filename);
			xmlFree(filename);
		    }
		}
	    }
	    /*
	     * drop anything else we won't handle it
	     */
	    if (name != NULL)
		xmlFree(name);
	    if (sysid != NULL)
		xmlFree(sysid);
	}
    }
    if (base != NULL)
	xmlFree(base);
    if (cur == NULL)
	return(-1);
    return(0);
}